

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LogicalOrLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalor(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x348) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x348;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LogicalOrLayerParams::LogicalOrLayerParams(this_00.logicalor_);
    (this->layer_).logicalor_ = (LogicalOrLayerParams *)this_00;
  }
  return (LogicalOrLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalOrLayerParams* NeuralNetworkLayer::mutable_logicalor() {
  if (!has_logicalor()) {
    clear_layer();
    set_has_logicalor();
    layer_.logicalor_ = new ::CoreML::Specification::LogicalOrLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalOr)
  return layer_.logicalor_;
}